

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O1

void dlep_extension_add_processing
               (dlep_extension *ext,_Bool radio,dlep_extension_implementation *processing,
               size_t proc_count)

{
  dlep_extension_implementation *pdVar1;
  dlep_extension_signal *pdVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  
  if (proc_count != 0) {
    sVar3 = 0;
    do {
      sVar5 = ext->signal_count;
      if (sVar5 != 0) {
        pdVar2 = ext->signals;
        pdVar1 = processing + sVar3;
        lVar4 = 0;
        do {
          if (*(int *)((long)&pdVar2->id + lVar4) == pdVar1->id) {
            if (radio) {
              *(_func_dlep_parser_error_dlep_extension_ptr_dlep_session_ptr **)
               ((long)&pdVar2->process_radio + lVar4) = pdVar1->process;
              *(_func_int_dlep_extension_ptr_dlep_session_ptr_oonf_layer2_neigh_key_ptr **)
               ((long)&ext->signals->add_radio_tlvs + lVar4) = pdVar1->add_tlvs;
            }
            else {
              *(_func_dlep_parser_error_dlep_extension_ptr_dlep_session_ptr **)
               ((long)&pdVar2->process_router + lVar4) = pdVar1->process;
              *(_func_int_dlep_extension_ptr_dlep_session_ptr_oonf_layer2_neigh_key_ptr **)
               ((long)&ext->signals->add_router_tlvs + lVar4) = pdVar1->add_tlvs;
            }
            break;
          }
          lVar4 = lVar4 + 0x58;
          sVar5 = sVar5 - 1;
        } while (sVar5 != 0);
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 != proc_count);
  }
  return;
}

Assistant:

void
dlep_extension_add_processing(
  struct dlep_extension *ext, bool radio, struct dlep_extension_implementation *processing, size_t proc_count) {
  size_t i, j;

  for (j = 0; j < proc_count; j++) {
    for (i = 0; i < ext->signal_count; i++) {
      if (ext->signals[i].id == processing[j].id) {
        if (radio) {
          ext->signals[i].process_radio = processing[j].process;
          ext->signals[i].add_radio_tlvs = processing[j].add_tlvs;
        }
        else {
          ext->signals[i].process_router = processing[j].process;
          ext->signals[i].add_router_tlvs = processing[j].add_tlvs;
        }
        break;
      }
    }
  }
}